

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlLoadShaderDefault(void)

{
  GLint GVar1;
  char *fShaderDefault;
  char *vShaderDefault;
  int i;
  
  RLGL.State.defaultShader.locs = (int *)calloc(0x20,4);
  for (vShaderDefault._4_4_ = 0; vShaderDefault._4_4_ < 0x20;
      vShaderDefault._4_4_ = vShaderDefault._4_4_ + 1) {
    RLGL.State.defaultShader.locs[vShaderDefault._4_4_] = -1;
  }
  RLGL.State.defaultVShaderId =
       rlCompileShader("#version 330                       \nin vec3 vertexPosition;            \nin vec2 vertexTexCoord;            \nin vec4 vertexColor;               \nout vec2 fragTexCoord;             \nout vec4 fragColor;                \nuniform mat4 mvp;                  \nvoid main()                        \n{                                  \n    fragTexCoord = vertexTexCoord; \n    fragColor = vertexColor;       \n    gl_Position = mvp*vec4(vertexPosition, 1.0); \n}                                  \n"
                       ,0x8b31);
  RLGL.State.defaultFShaderId =
       rlCompileShader("#version 330       \nin vec2 fragTexCoord;              \nin vec4 fragColor;                 \nout vec4 finalColor;               \nuniform sampler2D texture0;        \nuniform vec4 colDiffuse;           \nvoid main()                        \n{                                  \n    vec4 texelColor = texture(texture0, fragTexCoord);   \n    finalColor = texelColor*colDiffuse*fragColor;        \n}                                  \n"
                       ,0x8b30);
  RLGL.State.defaultShader.id =
       rlLoadShaderProgram(RLGL.State.defaultVShaderId,RLGL.State.defaultFShaderId);
  if (RLGL.State.defaultShader.id == 0) {
    TraceLog(4,"SHADER: [ID %i] Failed to load default shader",0);
  }
  else {
    TraceLog(3,"SHADER: [ID %i] Default shader loaded successfully",
             (ulong)RLGL.State.defaultShader.id);
    GVar1 = (*glad_glGetAttribLocation)(RLGL.State.defaultShader.id,"vertexPosition");
    *RLGL.State.defaultShader.locs = GVar1;
    GVar1 = (*glad_glGetAttribLocation)(RLGL.State.defaultShader.id,"vertexTexCoord");
    RLGL.State.defaultShader.locs[1] = GVar1;
    GVar1 = (*glad_glGetAttribLocation)(RLGL.State.defaultShader.id,"vertexColor");
    RLGL.State.defaultShader.locs[5] = GVar1;
    GVar1 = (*glad_glGetUniformLocation)(RLGL.State.defaultShader.id,"mvp");
    RLGL.State.defaultShader.locs[6] = GVar1;
    GVar1 = (*glad_glGetUniformLocation)(RLGL.State.defaultShader.id,"colDiffuse");
    RLGL.State.defaultShader.locs[0xc] = GVar1;
    GVar1 = (*glad_glGetUniformLocation)(RLGL.State.defaultShader.id,"texture0");
    RLGL.State.defaultShader.locs[0xf] = GVar1;
  }
  return;
}

Assistant:

static void rlLoadShaderDefault(void)
{
    RLGL.State.defaultShader.locs = (int *)RL_CALLOC(MAX_SHADER_LOCATIONS, sizeof(int));

    // NOTE: All locations must be reseted to -1 (no location)
    for (int i = 0; i < MAX_SHADER_LOCATIONS; i++) RLGL.State.defaultShader.locs[i] = -1;

    // Vertex shader directly defined, no external file required
    const char *vShaderDefault =
#if defined(GRAPHICS_API_OPENGL_21)
    "#version 120                       \n"
    "attribute vec3 vertexPosition;     \n"
    "attribute vec2 vertexTexCoord;     \n"
    "attribute vec4 vertexColor;        \n"
    "varying vec2 fragTexCoord;         \n"
    "varying vec4 fragColor;            \n"
#elif defined(GRAPHICS_API_OPENGL_33)
    "#version 330                       \n"
    "in vec3 vertexPosition;            \n"
    "in vec2 vertexTexCoord;            \n"
    "in vec4 vertexColor;               \n"
    "out vec2 fragTexCoord;             \n"
    "out vec4 fragColor;                \n"
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
    "#version 100                       \n"
    "attribute vec3 vertexPosition;     \n"
    "attribute vec2 vertexTexCoord;     \n"
    "attribute vec4 vertexColor;        \n"
    "varying vec2 fragTexCoord;         \n"
    "varying vec4 fragColor;            \n"
#endif
    "uniform mat4 mvp;                  \n"
    "void main()                        \n"
    "{                                  \n"
    "    fragTexCoord = vertexTexCoord; \n"
    "    fragColor = vertexColor;       \n"
    "    gl_Position = mvp*vec4(vertexPosition, 1.0); \n"
    "}                                  \n";

    // Fragment shader directly defined, no external file required
    const char *fShaderDefault =
#if defined(GRAPHICS_API_OPENGL_21)
    "#version 120                       \n"
    "varying vec2 fragTexCoord;         \n"
    "varying vec4 fragColor;            \n"
    "uniform sampler2D texture0;        \n"
    "uniform vec4 colDiffuse;           \n"
    "void main()                        \n"
    "{                                  \n"
    "    vec4 texelColor = texture2D(texture0, fragTexCoord); \n"
    "    gl_FragColor = texelColor*colDiffuse*fragColor;      \n"
    "}                                  \n";
#elif defined(GRAPHICS_API_OPENGL_33)
    "#version 330       \n"
    "in vec2 fragTexCoord;              \n"
    "in vec4 fragColor;                 \n"
    "out vec4 finalColor;               \n"
    "uniform sampler2D texture0;        \n"
    "uniform vec4 colDiffuse;           \n"
    "void main()                        \n"
    "{                                  \n"
    "    vec4 texelColor = texture(texture0, fragTexCoord);   \n"
    "    finalColor = texelColor*colDiffuse*fragColor;        \n"
    "}                                  \n";
#endif
#if defined(GRAPHICS_API_OPENGL_ES2)
    "#version 100                       \n"
    "precision mediump float;           \n"     // Precision required for OpenGL ES2 (WebGL)
    "varying vec2 fragTexCoord;         \n"
    "varying vec4 fragColor;            \n"
    "uniform sampler2D texture0;        \n"
    "uniform vec4 colDiffuse;           \n"
    "void main()                        \n"
    "{                                  \n"
    "    vec4 texelColor = texture2D(texture0, fragTexCoord); \n"
    "    gl_FragColor = texelColor*colDiffuse*fragColor;      \n"
    "}                                  \n";
#endif

    // NOTE: Compiled vertex/fragment shaders are kept for re-use
    RLGL.State.defaultVShaderId = rlCompileShader(vShaderDefault, GL_VERTEX_SHADER);     // Compile default vertex shader
    RLGL.State.defaultFShaderId = rlCompileShader(fShaderDefault, GL_FRAGMENT_SHADER);   // Compile default fragment shader

    RLGL.State.defaultShader.id = rlLoadShaderProgram(RLGL.State.defaultVShaderId, RLGL.State.defaultFShaderId);

    if (RLGL.State.defaultShader.id > 0)
    {
        TRACELOG(LOG_INFO, "SHADER: [ID %i] Default shader loaded successfully", RLGL.State.defaultShader.id);

        // Set default shader locations: attributes locations
        RLGL.State.defaultShader.locs[SHADER_LOC_VERTEX_POSITION] = glGetAttribLocation(RLGL.State.defaultShader.id, "vertexPosition");
        RLGL.State.defaultShader.locs[SHADER_LOC_VERTEX_TEXCOORD01] = glGetAttribLocation(RLGL.State.defaultShader.id, "vertexTexCoord");
        RLGL.State.defaultShader.locs[SHADER_LOC_VERTEX_COLOR] = glGetAttribLocation(RLGL.State.defaultShader.id, "vertexColor");

        // Set default shader locations: uniform locations
        RLGL.State.defaultShader.locs[SHADER_LOC_MATRIX_MVP]  = glGetUniformLocation(RLGL.State.defaultShader.id, "mvp");
        RLGL.State.defaultShader.locs[SHADER_LOC_COLOR_DIFFUSE] = glGetUniformLocation(RLGL.State.defaultShader.id, "colDiffuse");
        RLGL.State.defaultShader.locs[SHADER_LOC_MAP_DIFFUSE] = glGetUniformLocation(RLGL.State.defaultShader.id, "texture0");
    }
    else TRACELOG(LOG_WARNING, "SHADER: [ID %i] Failed to load default shader", RLGL.State.defaultShader.id);
}